

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadFloat3Tuple_Ascii<aiColor3D>(COBImporter *this,aiColor3D *fill,char **in)

{
  aiColor3D *paVar1;
  uint i;
  int iVar2;
  ai_real aVar3;
  char *rgb;
  char *local_38;
  
  local_38 = *in;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    SkipSpaces<char>(&local_38);
    if (*local_38 == ',') {
      local_38 = local_38 + 1;
    }
    SkipSpaces<char>(&local_38);
    aVar3 = fast_atof(&local_38);
    paVar1 = (aiColor3D *)&fill->b;
    if ((iVar2 != 2) && (paVar1 = fill, iVar2 == 1)) {
      paVar1 = (aiColor3D *)&fill->g;
    }
    paVar1->r = aVar3;
  }
  *in = local_38;
  return;
}

Assistant:

void COBImporter::ReadFloat3Tuple_Ascii(T& fill, const char** in)
{
    const char* rgb = *in;
    for(unsigned int i = 0; i < 3; ++i) {
        SkipSpaces(&rgb);
        if (*rgb == ',')++rgb;
        SkipSpaces(&rgb);

        fill[i] = fast_atof(&rgb);
    }
    *in = rgb;
}